

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

int __thiscall
notch::core::AdaDelta::clone
          (AdaDelta *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  float momentum;
  float epsilon;
  AdaDelta *this_00;
  float e;
  float m;
  AdaDelta *this_local;
  unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_> *c;
  
  momentum = *(float *)(__fn + 8);
  epsilon = *(float *)(__fn + 0xc);
  this_00 = (AdaDelta *)operator_new(0x20);
  AdaDelta(this_00,momentum,epsilon);
  ::std::unique_ptr<notch::core::ALearningPolicy,std::default_delete<notch::core::ALearningPolicy>>
  ::unique_ptr<std::default_delete<notch::core::ALearningPolicy>,void>
            ((unique_ptr<notch::core::ALearningPolicy,std::default_delete<notch::core::ALearningPolicy>>
              *)this,(pointer)this_00);
  return (int)this;
}

Assistant:

virtual std::unique_ptr<ALearningPolicy> clone() const {
        float m = momentum;
        float e = epsilon;
        auto c = std::unique_ptr<ALearningPolicy>(new AdaDelta(m, e));
        return c;
    }